

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryRegister.cpp
# Opt level: O3

BndryRegister * __thiscall amrex::BndryRegister::operator+=(BndryRegister *this,BndryRegister *rhs)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  Orientation f;
  Array4<double> dfab;
  Array4<const_double> sfab;
  FabSetIter bfsi;
  long local_188;
  Box local_12c;
  Array4<double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  lVar4 = 0;
  do {
    uVar1 = this->bndry[lVar4].m_mf.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp;
    MFIter::MFIter(&local_90,(FabArrayBase *)(rhs->bndry + lVar4),'\0');
    if (local_90.currentIndex < local_90.endIndex) {
      do {
        BATransformer::operator()
                  (&local_12c,&((local_90.fabArray)->boxarray).m_bat,
                   (Box *)((long)((local_90.index_map)->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[local_90.currentIndex] * 0x1c +
                          *(long *)&((((local_90.fabArray)->boxarray).m_ref.
                                      super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr)->m_abox).
                                    super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                    _M_impl.super__Vector_impl_data));
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_d0,(FabArray<amrex::FArrayBox> *)(rhs->bndry + lVar4),&local_90);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_110,(FabArray<amrex::FArrayBox> *)(this->bndry + lVar4),&local_90);
        if (0 < (int)uVar1) {
          lVar9 = (long)local_12c.smallend.vect[1];
          local_188 = 0;
          uVar3 = 0;
          do {
            iVar7 = local_12c.smallend.vect[2];
            if (local_12c.smallend.vect[2] <= local_12c.bigend.vect[2]) {
              do {
                if (local_12c.smallend.vect[1] <= local_12c.bigend.vect[1]) {
                  lVar8 = (long)local_d0.p +
                          local_d0.nstride * local_188 +
                          (lVar9 - local_d0.begin.y) * local_d0.jstride * 8 +
                          ((long)iVar7 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
                          (long)local_d0.begin.x * -8 + (long)local_12c.smallend.vect[0] * 8;
                  lVar2 = (long)local_110.p +
                          local_110.nstride * local_188 +
                          (lVar9 - local_110.begin.y) * local_110.jstride * 8 +
                          ((long)iVar7 - (long)local_110.begin.z) * local_110.kstride * 8 +
                          (long)local_110.begin.x * -8 + (long)local_12c.smallend.vect[0] * 8;
                  lVar5 = lVar9;
                  do {
                    if (local_12c.smallend.vect[0] <= local_12c.bigend.vect[0]) {
                      lVar6 = 0;
                      do {
                        *(double *)(lVar2 + lVar6 * 8) =
                             *(double *)(lVar8 + lVar6 * 8) + *(double *)(lVar2 + lVar6 * 8);
                        lVar6 = lVar6 + 1;
                      } while ((local_12c.bigend.vect[0] - local_12c.smallend.vect[0]) + 1 !=
                               (int)lVar6);
                    }
                    lVar5 = lVar5 + 1;
                    lVar8 = lVar8 + local_d0.jstride * 8;
                    lVar2 = lVar2 + local_110.jstride * 8;
                  } while (local_12c.bigend.vect[1] + 1 != (int)lVar5);
                }
                bVar10 = iVar7 != local_12c.bigend.vect[2];
                iVar7 = iVar7 + 1;
              } while (bVar10);
            }
            uVar3 = uVar3 + 1;
            local_188 = local_188 + 8;
          } while (uVar3 != uVar1);
        }
        MFIter::operator++(&local_90);
      } while (local_90.currentIndex < local_90.endIndex);
    }
    MFIter::~MFIter(&local_90);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  return this;
}

Assistant:

BndryRegister&
BndryRegister::operator+= (const BndryRegister& rhs)
{
    BL_ASSERT(grids == rhs.grids);
    for (OrientationIter face; face; ++face) {
        const auto f = face();
        const int ncomp = bndry[f].nComp();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (FabSetIter bfsi(rhs[f]); bfsi.isValid(); ++bfsi) {
            const Box& bx = bfsi.validbox();
            auto const sfab =   rhs[f].array(bfsi);
            auto       dfab = bndry[f].array(bfsi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
            {
                dfab(i,j,k,n) += sfab(i,j,k,n);
            });
        }
    }
    return *this;
}